

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O2

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::
start(AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this)

{
  anon_class_8_1_8991fb9c_for__M_head_impl local_20;
  thread local_18;
  
  local_20.this = this;
  std::thread::
  thread<aeron::concurrent::AgentRunner<aeron::ClientConductor,aeron::concurrent::SleepingIdleStrategy>::start()::_lambda()_1_,,void>
            (&local_18,&local_20);
  std::thread::operator=(&this->m_thread,&local_18);
  std::thread::~thread(&local_18);
  return;
}

Assistant:

inline void start()
    {
        m_thread = std::thread([&]()
        {
#if defined(AERON_COMPILER_MSVC)
#elif defined(Darwin)
            pthread_setname_np(m_name.c_str());
#else
            pthread_setname_np(pthread_self(), m_name.c_str());
#endif
            run();
        });
    }